

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void store_helper(CPUArchState_conflict30 *env,target_ulong_conflict addr,uint64_t val,
                 TCGMemOpIdx oi,uintptr_t retaddr,MemOp op)

{
  int iVar1;
  uc_struct *uc;
  void *pvVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  _Bool _Var7;
  uint uVar8;
  uint *puVar9;
  MemoryRegion *current;
  MemoryRegion_conflict *pMVar10;
  ulong addr_00;
  uint size;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  list_item *plVar16;
  ulong len;
  uint uVar17;
  CPUIOTLBEntry *iotlbentry;
  uint mmu_idx;
  uint page;
  ulong uVar18;
  MemOp in_stack_00000008;
  CPUTriCoreState *__mptr;
  uint local_94;
  ulong local_70;
  MemOp local_50;
  ulong mmu_idx_00;
  
  mmu_idx = oi & 0xf;
  mmu_idx_00 = (ulong)mmu_idx;
  uVar18 = (ulong)(mmu_idx << 4);
  uVar11 = addr >> 0xe;
  uVar14 = *(uint *)((long)env->gpr_a + (uVar18 - 0x40)) >> 6 & uVar11;
  local_70 = (ulong)uVar14;
  lVar13 = *(long *)((long)env->gpr_a + (uVar18 - 0x38));
  uVar15 = (ulong)(uVar14 << 6);
  uVar14 = oi >> 4 & 0x70;
  if (uVar14 != 0) {
    if (uVar14 == 0x70) {
      uVar14 = oi >> 4 & 3;
    }
    else {
      uVar14 = uVar14 >> 4;
    }
  }
  uc = (uc_struct *)env->uc;
  local_50 = op & MO_64;
  size = 1 << ((byte)op & 3);
  len = (ulong)size;
  local_94 = *(uint *)(lVar13 + 4 + uVar15);
  addr_00 = (ulong)addr;
  if ((~(-1 << ((byte)uVar14 & 0x1f)) & addr) != 0) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,addr_00,1,mmu_idx_00,retaddr);
  }
  puVar9 = (uint *)((long)env->gpr_a + (uVar18 - 0x40));
  lVar13 = lVar13 + uVar15;
  uVar14 = addr & 0xffffc000;
  if ((local_94 & 0xffffe000) != uVar14) {
    _Var7 = victim_tlb_hit(env,mmu_idx_00,local_70,4,uVar14);
    if (!_Var7) {
      cVar6 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                        (&env[-0x32].cpu_model,addr_00,len,1,mmu_idx_00,0,retaddr);
      if (cVar6 == '\0') goto LAB_00d1d774;
      uVar8 = uVar11 & *puVar9 >> 6;
      local_70 = (ulong)uVar8;
      lVar13 = (ulong)(uVar8 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
    }
    local_94 = *(uint *)(lVar13 + 4) & 0xffffdfff;
  }
  uVar8 = addr & 0x3fff;
  uVar15 = (ulong)(*(uint *)(lVar13 + 0xc) | uVar8);
  current = (*uc->memory_mapping)(uc,uVar15);
  if (uc->size_recur_mem == 0) {
    plVar16 = uc->hook[0xb].head;
    while (((plVar16 != (list_item *)0x0 && (pvVar2 = plVar16->data, pvVar2 != (void *)0x0)) &&
           ((*(char *)((long)pvVar2 + 0x14) != '\0' ||
            ((((uVar15 < *(ulong *)((long)pvVar2 + 0x18) ||
               (*(ulong *)((long)pvVar2 + 0x20) < uVar15)) &&
              (*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20))) ||
             ((**(code **)((long)pvVar2 + 0x28))
                        (uc,0x11,uVar15,len,val,*(undefined8 *)((long)pvVar2 + 0x30)),
             uc->stop_request == false))))))) {
      plVar16 = plVar16->next;
    }
  }
  if (current == (MemoryRegion *)0x0) {
    plVar16 = uc->hook[5].head;
    if (plVar16 != (list_item *)0x0) {
      bVar5 = 0;
      while (pvVar2 = plVar16->data, pvVar2 != (void *)0x0) {
        if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
            ((((*(ulong *)((long)pvVar2 + 0x18) <= uVar15 &&
               (uVar15 <= *(ulong *)((long)pvVar2 + 0x20))) ||
              (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) &&
             ((bVar5 = (**(code **)((long)pvVar2 + 0x28))
                                 (uc,0x14,uVar15,len,val,*(undefined8 *)((long)pvVar2 + 0x30)),
              bVar5 != 0 || (uc->stop_request != false)))))) ||
           (plVar16 = plVar16->next, plVar16 == (list_item *)0x0)) break;
      }
      if ((bVar5 & 1) != 0) {
        uc->invalid_error = 0;
        if ((local_94 & 0xffffe000) != uVar14) {
          _Var7 = victim_tlb_hit(env,mmu_idx_00,local_70,4,uVar14);
          if (!_Var7) {
            cVar6 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                              (&env[-0x32].cpu_model,addr_00,len,1,mmu_idx_00,0,retaddr);
            if (cVar6 == '\0') goto LAB_00d1d774;
            uVar12 = uVar11 & *puVar9 >> 6;
            local_70 = (ulong)uVar12;
            lVar13 = (ulong)(uVar12 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
          }
          local_94 = *(uint *)(lVar13 + 4) & 0xffffdfff;
        }
        uVar15 = (ulong)(*(uint *)(lVar13 + 0xc) | uVar8);
        current = (*uc->memory_mapping)(uc,uVar15);
        if (current == (MemoryRegion *)0x0) {
          uc->invalid_error = 0xb;
          goto LAB_00d1d2e0;
        }
        goto LAB_00d1d055;
      }
    }
    uc->invalid_addr = uVar15;
    uc->invalid_error = 7;
    goto LAB_00d1d2e0;
  }
LAB_00d1d055:
  if ((current->perms & 2) != 0) {
LAB_00d1d396:
    if (((uc->snapshot_level != 0) && (current->ram == true)) &&
       (current->priority < uc->snapshot_level)) {
      pMVar10 = memory_cow_tricore((uc_struct_conflict15 *)uc,(MemoryRegion_conflict *)current,
                                   (ulong)uVar14,0x4000);
      if (pMVar10 == (MemoryRegion_conflict *)0x0) {
        uc->invalid_addr = uVar15;
        uc->invalid_error = 1;
        goto LAB_00d1d2e0;
      }
      cVar6 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                        (&env[-0x32].cpu_model,uVar15,len,1,mmu_idx_00,0,retaddr);
      if (cVar6 == '\0') {
LAB_00d1d774:
        __assert_fail("ok",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                      ,0x3c7,
                      "void tlb_fill(CPUState *, target_ulong, int, MMUAccessType, int, uintptr_t)")
        ;
      }
      local_70._0_4_ = uVar11 & *puVar9 >> 6;
      lVar3 = *(long *)((long)env->gpr_a + (uVar18 - 0x38));
      lVar13 = lVar3 + (ulong)((uint)local_70 << 6);
      local_94 = *(uint *)(lVar3 + 4 + (ulong)((uint)local_70 << 6));
    }
    uVar11 = (uint)val;
    if ((local_94 & 0x3fff) == 0) {
      if ((local_50 == MO_8) || (0xffffffffffffbfff < (ulong)(uVar8 + size) - 0x4001)) {
        if (MO_BEQ < op) {
          return;
        }
        lVar13 = *(long *)(lVar13 + 0x10);
        switch(op) {
        case MO_8:
          *(char *)(lVar13 + addr_00) = (char)val;
          return;
        default:
          return;
        case MO_BEUW:
          val = (uint64_t)(ushort)((ushort)val << 8 | (ushort)val >> 8);
        case MO_16:
          *(short *)(lVar13 + addr_00) = (short)val;
          return;
        case MO_BEUL:
          val = (uint64_t)
                (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
                );
        case MO_32:
          *(int *)(lVar13 + addr_00) = (int)val;
          return;
        case MO_BEQ:
          val = val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
                (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
                (val & 0xff00) << 0x28 | val << 0x38;
        case MO_64:
          *(uint64_t *)(lVar13 + addr_00) = val;
          return;
        }
      }
    }
    else if ((size - 1 & addr) == 0) {
      iotlbentry = (CPUIOTLBEntry *)
                   (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) +
                   (ulong)((uint)local_70 << 4));
      if ((local_94 >> 10 & 1) != 0) {
        cpu_check_watchpoint_tricore
                  ((CPUState *)&env[-0x32].cpu_model,addr_00,len,iotlbentry->attrs,2,retaddr);
      }
      bVar5 = (byte)(local_94 >> 9) & 1 & local_50 != MO_8;
      if ((local_94 >> 0xb & 1) == 0) {
        if ((local_94 >> 8 & 1) != 0) {
          return;
        }
        if ((local_94 >> 0xc & 1) != 0) {
          notdirty_write((CPUState *)&env[-0x32].cpu_model,addr_00,size,iotlbentry,retaddr);
        }
        if (bVar5 != 0) {
          op = op ^ MO_BE;
        }
        store_memop((void *)(addr_00 + *(long *)(lVar13 + 0x10)),val,op);
        return;
      }
      io_writex(env,iotlbentry,uVar11,(ulong)addr,(target_ulong_conflict)retaddr,
                (ulong)((uint)bVar5 << 3 ^ op),in_stack_00000008);
      return;
    }
    uVar8 = (uint)(len + addr_00);
    page = uVar8 & 0xffffc000;
    uVar14 = uVar8 & 0x3fff;
    uVar12 = (uint)(len + addr_00 >> 0xe) & 0x3ffff;
    uVar17 = *puVar9 >> 6 & uVar12;
    lVar13 = *(long *)((long)env->gpr_a + (uVar18 - 0x38));
    uVar11 = *(uint *)(lVar13 + 4 + (ulong)(uVar17 << 6));
    if ((uVar11 & 0xffffe000) != page) {
      _Var7 = victim_tlb_hit(env,mmu_idx_00,(ulong)uVar17,4,page);
      if (_Var7) {
        lVar13 = lVar13 + (ulong)(uVar17 << 6);
      }
      else {
        tlb_fill((CPUState *)&env[-0x32].cpu_model,page,uVar14,MMU_DATA_STORE,mmu_idx,retaddr);
        uVar17 = uVar12 & *puVar9 >> 6;
        lVar13 = (ulong)(uVar17 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
      }
      uVar11 = *(uint *)(lVar13 + 4);
    }
    if ((local_94 >> 10 & 1) != 0) {
      cpu_check_watchpoint_tricore
                ((CPUState *)&env[-0x32].cpu_model,addr_00,len - uVar14,
                 *(MemTxAttrs *)
                  (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) + 8 +
                  (ulong)((uint)local_70 << 4)),2,retaddr);
    }
    if ((uVar11 >> 10 & 1) != 0) {
      cpu_check_watchpoint_tricore
                ((CPUState *)&env[-0x32].cpu_model,(ulong)(uVar8 & 0xffffc000),(ulong)uVar14,
                 *(MemTxAttrs *)
                  (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) + 8 + (ulong)(uVar17 << 4)),2,
                 retaddr);
    }
    iVar1 = uc->size_recur_mem;
    uc->size_recur_mem = size;
    lVar13 = len * 8;
    bVar5 = 0;
    do {
      lVar13 = lVar13 + -8;
      bVar4 = (byte)lVar13;
      if ((op & MO_BE) == MO_8) {
        bVar4 = bVar5;
      }
      store_helper(env,addr,val >> (bVar4 & 0x3f) & 0xff,oi,retaddr,MO_8);
      addr = addr + 1;
      bVar5 = bVar5 + 8;
      len = len - 1;
    } while (len != 0);
    uc->size_recur_mem = iVar1;
    return;
  }
  plVar16 = uc->hook[8].head;
  if (plVar16 != (list_item *)0x0) {
    bVar5 = 0;
    do {
      pvVar2 = plVar16->data;
      if ((pvVar2 == (void *)0x0) ||
         (((*(char *)((long)pvVar2 + 0x14) == '\0' &&
           (((*(ulong *)((long)pvVar2 + 0x18) <= uVar15 &&
             (uVar15 <= *(ulong *)((long)pvVar2 + 0x20))) ||
            (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))))) &&
          ((bVar5 = (**(code **)((long)pvVar2 + 0x28))
                              (uc,0x16,uVar15,len,val,*(undefined8 *)((long)pvVar2 + 0x30)),
           bVar5 != 0 || (uc->stop_request != false)))))) break;
      plVar16 = plVar16->next;
    } while (plVar16 != (list_item *)0x0);
    if ((bVar5 & 1) != 0) {
      if ((local_94 & 0xffffe000) != uVar14) {
        _Var7 = victim_tlb_hit(env,mmu_idx_00,local_70,4,uVar14);
        if (!_Var7) {
          cVar6 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                            (&env[-0x32].cpu_model,addr_00,len,1,mmu_idx_00,0,retaddr);
          if (cVar6 == '\0') goto LAB_00d1d774;
          uVar12 = uVar11 & *puVar9 >> 6;
          local_70 = (ulong)uVar12;
          lVar13 = (ulong)(uVar12 << 6) + *(long *)((long)env->gpr_a + (uVar18 - 0x38));
        }
        local_94 = *(uint *)(lVar13 + 4) & 0xffffdfff;
      }
      uc->invalid_error = 0;
      goto LAB_00d1d396;
    }
  }
  uc->invalid_addr = uVar15;
  uc->invalid_error = 0xc;
LAB_00d1d2e0:
  cpu_exit(uc->cpu);
  return;
}

Assistant:

static void inline
store_helper(CPUArchState *env, target_ulong addr, uint64_t val,
             TCGMemOpIdx oi, uintptr_t retaddr, MemOp op)
{
    struct uc_struct *uc = env->uc;
    HOOK_FOREACH_VAR_DECLARE;
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = tlb_addr_write(entry);
    target_ulong paddr;
    const size_t tlb_off = offsetof(CPUTLBEntry, addr_write);
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    size_t size = memop_size(op);
    struct hook *hook;
    bool handled;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, MMU_DATA_STORE,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                     mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
    }

    // Load the latest memory mapping.
    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    if (!uc->size_recur_mem) { // disabling write callback if in recursive call
        // Unicorn: callback on memory write
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(uc, UC_MEM_WRITE, paddr, size, val, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }
    }

    // Unicorn: callback on invalid memory
    if (mr == NULL) {
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_UNMAPPED) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_UNMAPPED, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (!handled) {
            // save error & quit
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_UNMAPPED;
            // printf("***** Invalid memory write at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        } else {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                cpu_exit(uc->cpu);
                return;
            }
        }
    }

    // Unicorn: callback on non-writable memory
    if (mr != NULL && !(mr->perms & UC_PROT_WRITE)) {  //non-writable
        // printf("not writable memory???\n");
        handled = false;
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_WRITE_PROT) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_WRITE_PROT, paddr, size, val, hook->user_data)))
                break;

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        if (handled) {
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size, MMU_DATA_STORE,
                             mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = tlb_addr_write(entry) & ~TLB_INVALID_MASK;
            }
            uc->invalid_error = UC_ERR_OK;
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_WRITE_PROT;
            // printf("***** Invalid memory write (ro) at " TARGET_FMT_lx "\n", addr);
            cpu_exit(uc->cpu);
            return;
        }
    }

    if (uc->snapshot_level && mr->ram && mr->priority < uc->snapshot_level) {
        mr = memory_cow(uc, mr, addr & TARGET_PAGE_MASK, TARGET_PAGE_SIZE);
        if (!mr) {
            uc->invalid_addr = paddr;
            uc->invalid_error = UC_ERR_NOMEM;
            cpu_exit(uc->cpu);
            return;
        }
        /* refill tlb after CoW */
        tlb_fill(env_cpu(env), paddr, size, MMU_DATA_STORE,
                 mmu_idx, retaddr);
        index = tlb_index(env, mmu_idx, addr);
        entry = tlb_entry(env, mmu_idx, addr);
        tlb_addr = tlb_addr_write(entry);
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through byte stores.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_WRITE, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (tlb_addr & TLB_MMIO) {
            io_writex(env, iotlbentry, mmu_idx, val, addr, retaddr,
                      op ^ (need_swap * MO_BSWAP));
            return;
        }

        /* Ignore writes to ROM.  */
        if (unlikely(tlb_addr & TLB_DISCARD_WRITE)) {
            return;
        }

        /* Handle clean RAM pages.  */
        if (tlb_addr & TLB_NOTDIRTY) {
            notdirty_write(env_cpu(env), addr, size, iotlbentry, retaddr);
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two store_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            store_memop(haddr, val, op ^ MO_BSWAP);
        } else {
            store_memop(haddr, val, op);
        }
        return;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                     >= TARGET_PAGE_SIZE)) {
        int i;
        uintptr_t index2;
        CPUTLBEntry *entry2;
        target_ulong page2, tlb_addr2;
        size_t size2;
        int old_size;

    do_unaligned_access:
        /*
         * Ensure the second page is in the TLB.  Note that the first page
         * is already guaranteed to be filled, and that the second page
         * cannot evict the first.
         */
        page2 = (addr + size) & TARGET_PAGE_MASK;
        size2 = (addr + size) & ~TARGET_PAGE_MASK;
        index2 = tlb_index(env, mmu_idx, page2);
        entry2 = tlb_entry(env, mmu_idx, page2);
        tlb_addr2 = tlb_addr_write(entry2);
        if (!tlb_hit_page(uc, tlb_addr2, page2)) {
            if (!victim_tlb_hit(env, mmu_idx, index2, tlb_off, page2)) {
                tlb_fill(env_cpu(env), page2, size2, MMU_DATA_STORE,
                         mmu_idx, retaddr);
                index2 = tlb_index(env, mmu_idx, page2);
                entry2 = tlb_entry(env, mmu_idx, page2);
            }
            tlb_addr2 = tlb_addr_write(entry2);
        }

        /*
         * Handle watchpoints.  Since this may trap, all checks
         * must happen before any store.
         */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), addr, size - size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index].attrs,
                                 BP_MEM_WRITE, retaddr);
        }
        if (unlikely(tlb_addr2 & TLB_WATCHPOINT)) {
            cpu_check_watchpoint(env_cpu(env), page2, size2,
                                 env_tlb(env)->d[mmu_idx].iotlb[index2].attrs,
                                 BP_MEM_WRITE, retaddr);
        }

        /*
         * XXX: not efficient, but simple.
         * This loop must go in the forward direction to avoid issues
         * with self-modifying code in Windows 64-bit.
         */
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        for (i = 0; i < size; ++i) {
            uint8_t val8;
            if (memop_big_endian(op)) {
                /* Big-endian extract.  */
                val8 = val >> (((size - 1) * 8) - (i * 8));
            } else {
                /* Little-endian extract.  */
                val8 = val >> (i * 8);
            }
            helper_ret_stb_mmu(env, addr + i, val8, oi, retaddr);
        }
        uc->size_recur_mem = old_size;
        return;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    store_memop(haddr, val, op);
}